

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_start_conn(sfd_listener *l,nni_aio *aio)

{
  int local_2c;
  nni_sfd_conn *pnStack_28;
  int i;
  nni_sfd_conn *c;
  int rv;
  int fd;
  nni_aio *aio_local;
  sfd_listener *l_local;
  
  _rv = aio;
  aio_local = (nni_aio *)l;
  if (l->listen_cnt < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockfd.c",
              0x56,"l->listen_cnt > 0");
  }
  c._4_4_ = (aio_local->a_task).task_mtx.mtx.__data.__count;
  for (local_2c = 1; local_2c < (aio_local->a_task).task_mtx.mtx.__data.__lock;
      local_2c = local_2c + 1) {
    *(undefined4 *)((long)aio_local->a_iov + (long)local_2c * 4 + -0x5c) =
         *(undefined4 *)((long)aio_local->a_iov + (long)(local_2c + 1) * 4 + -0x5c);
  }
  (aio_local->a_task).task_mtx.mtx.__data.__lock =
       (aio_local->a_task).task_mtx.mtx.__data.__lock + -1;
  c._0_4_ = nni_sfd_conn_alloc(&stack0xffffffffffffffd8,c._4_4_);
  if ((nng_err)c == NNG_OK) {
    nni_aio_set_output(_rv,0,pnStack_28);
    nni_aio_finish(_rv,NNG_OK,0);
  }
  else {
    nni_aio_finish_error(_rv,(nng_err)c);
    nni_sfd_close_fd(c._4_4_);
  }
  return;
}

Assistant:

static void
sfd_start_conn(sfd_listener *l, nni_aio *aio)
{
	int           fd;
	int           rv;
	nni_sfd_conn *c;
	NNI_ASSERT(l->listen_cnt > 0);
	fd = l->listen_q[0];
	for (int i = 1; i < l->listen_cnt; i++) {
		l->listen_q[i] = l->listen_q[i + 1];
	}
	l->listen_cnt--;
	if ((rv = nni_sfd_conn_alloc(&c, fd)) != 0) {
		nni_aio_finish_error(aio, rv);
		nni_sfd_close_fd(fd);
	} else {
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}